

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

interresult __thiscall tetgenmesh::finddirection(tetgenmesh *this,triface *searchtet,point endpt)

{
  tetrahedron pa;
  undefined4 *puVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  tetrahedron ppdVar8;
  tetrahedron *pppdVar9;
  tetrahedron pc;
  tetrahedron pc_00;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pppdVar9 = searchtet->tet;
  iVar2 = searchtet->ver;
  pa = pppdVar9[orgpivot[iVar2]];
  if (pppdVar9[7] == (tetrahedron)this->dummypoint) {
    pppdVar9 = (tetrahedron *)((ulong)pppdVar9[3] & 0xfffffffffffffff0);
    searchtet->tet = pppdVar9;
    if (pppdVar9[4] == pa) {
      iVar2 = 0xb;
    }
    else if (pppdVar9[5] == pa) {
      iVar2 = 3;
    }
    else {
      iVar2 = 7;
      if (pppdVar9[6] != pa) {
        iVar2 = 0;
      }
    }
    searchtet->ver = iVar2;
  }
  lVar4 = (long)iVar2;
  ppdVar8 = pppdVar9[destpivot[lVar4]];
  if (ppdVar8 != (tetrahedron)endpt) {
    pc = pppdVar9[apexpivot[lVar4]];
    if (pc == (tetrahedron)endpt) {
      iVar2 = eprevesymtbl[lVar4];
    }
    else {
      pc_00 = pppdVar9[oppopivot[lVar4]];
      while (pc_00 != (tetrahedron)endpt) {
        if (pc_00 == (tetrahedron)this->dummypoint) {
          if (this->nonconvex != 0) {
            return ACROSSFACE;
          }
          puVar1 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar1 = 2;
          __cxa_throw(puVar1,&int::typeinfo,0);
        }
        dVar10 = orient3d((double *)pa,(double *)ppdVar8,(double *)pc,endpt);
        dVar11 = orient3d((double *)ppdVar8,(double *)pa,(double *)pc_00,endpt);
        dVar12 = orient3d((double *)pa,(double *)pc,(double *)pc_00,endpt);
        if (dVar10 <= 0.0) {
          if (dVar11 <= 0.0) {
            if (dVar12 <= 0.0) {
              if ((dVar10 != 0.0) || (NAN(dVar10))) {
                if ((dVar11 == 0.0) && (!NAN(dVar11))) {
                  iVar2 = esymtbl[searchtet->ver];
                  searchtet->ver = iVar2;
                  searchtet->ver = enexttbl[iVar2];
                  return ACROSSEDGE - (dVar12 == 0.0);
                }
                if ((dVar12 != 0.0) || (NAN(dVar12))) {
                  return ACROSSFACE;
                }
                searchtet->ver = eprevesymtbl[searchtet->ver];
              }
              else {
                if ((dVar11 == 0.0) && (!NAN(dVar11))) {
                  return ACROSSVERT;
                }
                if ((dVar12 == 0.0) && (!NAN(dVar12))) {
                  searchtet->ver = eprevesymtbl[searchtet->ver];
                  return ACROSSVERT;
                }
              }
              return ACROSSEDGE;
            }
          }
          else if ((dVar12 <= 0.0) ||
                  (uVar5 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar5,
                  (uVar5 & 1) != 0)) goto LAB_0012a1a0;
LAB_0012a150:
          iVar2 = eprevtbl[searchtet->ver];
          searchtet->ver = iVar2;
          ppdVar8 = searchtet->tet[facepivot1[iVar2]];
          uVar7 = (uint)ppdVar8 & 0xf;
          searchtet->ver = uVar7;
          pppdVar9 = (tetrahedron *)((ulong)ppdVar8 & 0xfffffffffffffff0);
          searchtet->tet = pppdVar9;
          iVar2 = facepivot2[iVar2][uVar7];
LAB_0012a210:
          searchtet->ver = iVar2;
          piVar6 = enexttbl + iVar2;
        }
        else {
          if (dVar11 <= 0.0) {
            if ((dVar12 <= 0.0) ||
               (uVar5 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar5,
               (uVar5 & 1) != 0)) goto LAB_0012a1dd;
            goto LAB_0012a150;
          }
          uVar5 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
          this->randomseed = uVar5;
          if (0.0 < dVar12) {
            iVar2 = (int)uVar5 + (int)(uVar5 / 3) * -3;
            if (iVar2 != 0) {
              if (iVar2 != 1) goto LAB_0012a150;
              goto LAB_0012a1a0;
            }
LAB_0012a1dd:
            uVar7 = searchtet->ver;
            ppdVar8 = searchtet->tet[uVar7 & 3];
            uVar3 = (uint)ppdVar8 & 0xf;
            searchtet->ver = uVar3;
            pppdVar9 = (tetrahedron *)((ulong)ppdVar8 & 0xfffffffffffffff0);
            searchtet->tet = pppdVar9;
            iVar2 = fsymtbl[(int)uVar7][uVar3];
            goto LAB_0012a210;
          }
          if ((uVar5 & 1) != 0) goto LAB_0012a1dd;
LAB_0012a1a0:
          iVar2 = searchtet->ver;
          ppdVar8 = searchtet->tet[facepivot1[iVar2]];
          uVar7 = (uint)ppdVar8 & 0xf;
          searchtet->ver = uVar7;
          pppdVar9 = (tetrahedron *)((ulong)ppdVar8 & 0xfffffffffffffff0);
          searchtet->tet = pppdVar9;
          piVar6 = facepivot2[iVar2] + uVar7;
        }
        lVar4 = (long)*piVar6;
        searchtet->ver = *piVar6;
        ppdVar8 = pppdVar9[destpivot[lVar4]];
        pc = pppdVar9[apexpivot[lVar4]];
        pc_00 = pppdVar9[oppopivot[lVar4]];
      }
      iVar2 = esymtbl[lVar4];
      searchtet->ver = iVar2;
      iVar2 = enexttbl[iVar2];
    }
    searchtet->ver = iVar2;
  }
  return ACROSSVERT;
}

Assistant:

enum tetgenmesh::interresult 
  tetgenmesh::finddirection(triface* searchtet, point endpt)
{
  triface neightet;
  point pa, pb, pc, pd;
  enum {HMOVE, RMOVE, LMOVE} nextmove;
  REAL hori, rori, lori;
  int t1ver;
  int s;

  // The origin is fixed.
  pa = org(*searchtet);
  if ((point) searchtet->tet[7] == dummypoint) {
    // A hull tet. Choose the neighbor of its base face.
    decode(searchtet->tet[3], *searchtet);
    // Reset the origin to be pa.
    if ((point) searchtet->tet[4] == pa) {
      searchtet->ver = 11;
    } else if ((point) searchtet->tet[5] == pa) {
      searchtet->ver = 3;
    } else if ((point) searchtet->tet[6] == pa) {
      searchtet->ver = 7;
    } else {
      searchtet->ver = 0;
    }
  }

  pb = dest(*searchtet);
  // Check whether the destination or apex is 'endpt'.
  if (pb == endpt) {
    // pa->pb is the search edge.
    return ACROSSVERT;
  }

  pc = apex(*searchtet);
  if (pc == endpt) {
    // pa->pc is the search edge.
    eprevesymself(*searchtet);
    return ACROSSVERT;
  }

  // Walk through tets around pa until the right one is found.
  while (1) {

    pd = oppo(*searchtet);
    // Check whether the opposite vertex is 'endpt'.
    if (pd == endpt) {
      // pa->pd is the search edge.
      esymself(*searchtet);
      enextself(*searchtet);
      return ACROSSVERT;
    }
    // Check if we have entered outside of the domain.
    if (pd == dummypoint) {
      // This is possible when the mesh is non-convex.
      if (nonconvex) {
        return ACROSSFACE; // return ACROSSSUB; // Hit a bounday.
      } else {
        terminatetetgen(this, 2);
      }
    }

    // Now assume that the base face abc coincides with the horizon plane,
    //   and d lies above the horizon.  The search point 'endpt' may lie
    //   above or below the horizon.  We test the orientations of 'endpt'
    //   with respect to three planes: abc (horizon), bad (right plane),
    //   and acd (left plane). 
    hori = orient3d(pa, pb, pc, endpt);
    rori = orient3d(pb, pa, pd, endpt);
    lori = orient3d(pa, pc, pd, endpt);

    // Now decide the tet to move.  It is possible there are more than one
    //   tets are viable moves. Is so, randomly choose one. 
    if (hori > 0) {
      if (rori > 0) {
        if (lori > 0) {
          // Any of the three neighbors is a viable move.
          s = randomnation(3); 
          if (s == 0) {
            nextmove = HMOVE;
          } else if (s == 1) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // Two tets, below horizon and below right, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = RMOVE;
          }
        }
      } else {
        if (lori > 0) {
          // Two tets, below horizon and below left, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below horizon is chosen.
          nextmove = HMOVE;
        }
      }
    } else {
      if (rori > 0) {
        if (lori > 0) {
          // Two tets, below right and below left, are viable.
          if (randomnation(2)) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below right is chosen.
          nextmove = RMOVE;
        }
      } else {
        if (lori > 0) {
          // The tet below left is chosen.
          nextmove = LMOVE;
        } else {
          // 'endpt' lies either on the plane(s) or across face bcd.
          if (hori == 0) {
            if (rori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pb.
              return ACROSSVERT;
            }
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pc.
              eprevesymself(*searchtet); // [a,c,d]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pc.
            return ACROSSEDGE;
          }
          if (rori == 0) {
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pd.
              esymself(*searchtet); // face bad.
              enextself(*searchtet); // face [a,d,b]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pd.
            esymself(*searchtet); // face bad.
            enextself(*searchtet); // face adb
            return ACROSSEDGE;
          }
          if (lori == 0) {
            // pa->'endpt' crosses the edge pc->pd.
            eprevesymself(*searchtet); // [a,c,d]
            return ACROSSEDGE;
          }
          // pa->'endpt' crosses the face bcd.
          return ACROSSFACE;
        }
      }
    }

    // Move to the next tet, fix pa as its origin.
    if (nextmove == RMOVE) {
      fnextself(*searchtet);
    } else if (nextmove == LMOVE) {
      eprevself(*searchtet);
      fnextself(*searchtet);
      enextself(*searchtet);
    } else { // HMOVE
      fsymself(*searchtet);
      enextself(*searchtet);
    }
    pb = dest(*searchtet);
    pc = apex(*searchtet);

  } // while (1)

}